

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.cpp
# Opt level: O3

NodeRef __thiscall slang::IntervalMapDetails::Path::getLeftSibling(Path *this,uint32_t level)

{
  pointer pEVar1;
  PointerIntPair<void_*,_6U,_6U,_unsigned_int> PVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  
  pEVar1 = (this->path).super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
  uVar5 = 0;
  iVar6 = -1;
  iVar3 = 0;
  do {
    iVar4 = iVar3;
    if (level - 1 == iVar4) goto LAB_003c608d;
    uVar7 = level + iVar6;
    iVar6 = iVar6 + -1;
    iVar3 = iVar4 + 1;
  } while (pEVar1[uVar7].offset == 0);
  uVar5 = (ulong)(level - (iVar4 + 1));
LAB_003c608d:
  if (pEVar1[uVar5].offset == 0) {
    return (NodeRef)0;
  }
  PVar2.value = *(ulong *)((long)pEVar1[uVar5].node + (ulong)(pEVar1[uVar5].offset - 1) * 8);
  for (; iVar4 != 0; iVar4 = iVar4 + -1) {
    PVar2.value = *(ulong *)((PVar2.value & 0xffffffffffffffc0) +
                            (ulong)((uint)PVar2.value & 0x3f) * 8);
  }
  return (NodeRef)(PointerIntPair<void_*,_6U,_6U,_unsigned_int>)PVar2.value;
}

Assistant:

NodeRef Path::getLeftSibling(uint32_t level) const {
    SLANG_ASSERT(level > 0);

    // Go up until we can go left.
    uint32_t l = level - 1;
    while (l && path[l].offset == 0)
        --l;

    // If we hit the root there is no left sibling.
    if (path[l].offset == 0)
        return NodeRef();

    // Start with left subtree and go down to the right
    // until we reach the original level.
    NodeRef node = path[l].childAt(path[l].offset - 1);
    for (++l; l != level; ++l)
        node = node.childAt(node.size() - 1);
    return node;
}